

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

mz_bool mz_zip_reader_extract_file_to_mem_no_alloc
                  (mz_zip_archive *pZip,char *pFilename,void *pBuf,size_t buf_size,mz_uint flags,
                  void *pUser_read_buf,size_t user_read_buf_size)

{
  mz_uint file_index;
  mz_bool mVar1;
  
  file_index = mz_zip_reader_locate_file(pZip,pFilename,(char *)0x0,flags);
  if (-1 < (int)file_index) {
    mVar1 = mz_zip_reader_extract_to_mem_no_alloc
                      (pZip,file_index,pBuf,buf_size,flags,pUser_read_buf,user_read_buf_size);
    return mVar1;
  }
  return 0;
}

Assistant:

mz_bool mz_zip_reader_extract_file_to_mem_no_alloc(
    mz_zip_archive *pZip, const char *pFilename, void *pBuf, size_t buf_size,
    mz_uint flags, void *pUser_read_buf, size_t user_read_buf_size) {
  int file_index = mz_zip_reader_locate_file(pZip, pFilename, NULL, flags);
  if (file_index < 0)
    return MZ_FALSE;
  return mz_zip_reader_extract_to_mem_no_alloc(pZip, file_index, pBuf, buf_size,
                                               flags, pUser_read_buf,
                                               user_read_buf_size);
}